

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

int Acb_ObjComputePathR(Acb_Ntk_t *p,int iObj)

{
  int iObj_00;
  Vec_Int_t *pVVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  if (0 < iObj) {
    if ((p->vObjType).nSize <= iObj) {
LAB_003b11e2:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                    ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
    }
    if ((p->vObjType).pArray[(uint)iObj] == '\x04') {
      __assert_fail("!Acb_ObjIsCo(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                    ,0x1c2,"int Acb_ObjComputePathR(Acb_Ntk_t *, int)");
    }
    if (iObj < (p->vFanouts).nSize) {
      lVar3 = 0;
      iVar4 = 0;
      do {
        pVVar1 = (p->vFanouts).pArray;
        if (pVVar1[(uint)iObj].nSize <= lVar3) {
          if (iObj < (p->vPathR).nSize) {
            (p->vPathR).pArray[(uint)iObj] = iVar4;
            return iVar4;
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        iObj_00 = pVVar1[(uint)iObj].pArray[lVar3];
        lVar5 = (long)iObj_00;
        if (lVar5 < 1) goto LAB_003b11c3;
        if ((p->vObjType).nSize <= iObj_00) goto LAB_003b11e2;
        if ((p->vObjType).pArray[lVar5] != '\0') {
          iVar2 = Acb_ObjSlack(p,iObj_00);
          if (iVar2 == 0) {
            if ((p->vPathR).nSize <= iObj_00) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar4 = iVar4 + (p->vPathR).pArray[lVar5];
          }
        }
        lVar3 = lVar3 + 1;
      } while (iObj < (p->vFanouts).nSize);
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
LAB_003b11c3:
  __assert_fail("i>0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
}

Assistant:

int Acb_ObjComputePathR( Acb_Ntk_t * p, int iObj )
{
    int iFanout, k, Path = 0;
    assert( !Acb_ObjIsCo(p, iObj) );
    Acb_ObjForEachFanout( p, iObj, iFanout, k )
        if ( !Acb_ObjSlack(p, iFanout) )
            Path += Acb_ObjPathR(p, iFanout);
    return Acb_ObjSetPathR( p, iObj, Path );
}